

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::convert_global_masks_into_individual(Map *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference ppEVar4;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *pvVar5;
  EntityMaskFlag local_80;
  ulong local_70;
  size_t i_1;
  GlobalEntityMaskFlag *flag_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *__range1_1;
  ulong local_38;
  size_t i;
  GlobalEntityMaskFlag *flag;
  iterator __end1;
  iterator __begin1;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *__range1;
  Map *this_local;
  
  __end1 = std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::begin
                     (&this->_global_entity_mask_flags);
  flag = (GlobalEntityMaskFlag *)
         std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::end
                   (&this->_global_entity_mask_flags);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                      (&__end1,(__normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                                *)&flag);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    i = (size_t)__gnu_cxx::
                __normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                ::operator*(&__end1);
    local_38 = (ulong)(byte)(((reference)i)->super_Flag).field_0xb;
    while( true ) {
      uVar1 = local_38;
      sVar3 = std::vector<Entity_*,_std::allocator<Entity_*>_>::size(&this->_entities);
      if (sVar3 <= uVar1) break;
      ppEVar4 = std::vector<Entity_*,_std::allocator<Entity_*>_>::operator[]
                          (&this->_entities,local_38);
      pvVar5 = Entity::mask_flags(*ppEVar4);
      EntityMaskFlag::EntityMaskFlag
                ((EntityMaskFlag *)&__range1_1,false,(uint8_t)*(undefined2 *)(i + 8),
                 *(uint8_t *)(i + 10));
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                (pvVar5,(EntityMaskFlag *)&__range1_1);
      local_38 = local_38 + 1;
    }
    __gnu_cxx::
    __normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::begin
                       (&this->_key_door_mask_flags);
  flag_1 = (GlobalEntityMaskFlag *)
           std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::end
                     (&this->_key_door_mask_flags);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                      (&__end1_1,
                       (__normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                        *)&flag_1);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    i_1 = (size_t)__gnu_cxx::
                  __normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                  ::operator*(&__end1_1);
    local_70 = (ulong)(byte)(((reference)i_1)->super_Flag).field_0xb;
    while( true ) {
      uVar1 = local_70;
      sVar3 = std::vector<Entity_*,_std::allocator<Entity_*>_>::size(&this->_entities);
      if (sVar3 <= uVar1) break;
      ppEVar4 = std::vector<Entity_*,_std::allocator<Entity_*>_>::operator[]
                          (&this->_entities,local_70);
      pvVar5 = Entity::mask_flags(*ppEVar4);
      EntityMaskFlag::EntityMaskFlag
                (&local_80,false,(uint8_t)*(undefined2 *)(i_1 + 8),*(uint8_t *)(i_1 + 10));
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                (pvVar5,&local_80);
      local_70 = local_70 + 1;
    }
    __gnu_cxx::
    __normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::clear
            (&this->_global_entity_mask_flags);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::clear
            (&this->_key_door_mask_flags);
  return;
}

Assistant:

void Map::convert_global_masks_into_individual()
{
    for(const GlobalEntityMaskFlag& flag : _global_entity_mask_flags)
    {
        for(size_t i=flag.first_entity_id ; i<_entities.size() ; ++i)
            _entities[i]->mask_flags().emplace_back(EntityMaskFlag(false, flag.byte, flag.bit));
    }

    for(const GlobalEntityMaskFlag& flag : _key_door_mask_flags)
    {
        for(size_t i=flag.first_entity_id ; i<_entities.size() ; ++i)
            _entities[i]->mask_flags().emplace_back(EntityMaskFlag(false, flag.byte, flag.bit));
    }

    _global_entity_mask_flags.clear();
    _key_door_mask_flags.clear();
}